

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O0

t_int * clip_perform(t_int *w)

{
  long lVar1;
  float local_30;
  int local_2c;
  t_sample f;
  int n;
  t_sample *out;
  t_sample *in;
  t_clip *x;
  t_int *w_local;
  
  lVar1 = w[1];
  local_2c = (int)w[4];
  _f = (float *)w[3];
  out = (t_sample *)w[2];
  while (local_2c != 0) {
    local_30 = *out;
    if (local_30 < *(float *)(lVar1 + 0x34)) {
      local_30 = *(float *)(lVar1 + 0x34);
    }
    if (*(float *)(lVar1 + 0x38) <= local_30 && local_30 != *(float *)(lVar1 + 0x38)) {
      local_30 = *(float *)(lVar1 + 0x38);
    }
    *_f = local_30;
    local_2c = local_2c + -1;
    _f = _f + 1;
    out = out + 1;
  }
  return w + 5;
}

Assistant:

static t_int *clip_perform(t_int *w)
{
    t_clip *x = (t_clip *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample f = *in++;
        if (f < x->x_lo) f = x->x_lo;
        if (f > x->x_hi) f = x->x_hi;
        *out++ = f;
    }
    return (w+5);
}